

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena_inlines_b.h
# Opt level: O3

void arena_dalloc_no_tcache(tsdn_t *tsdn,void *ptr)

{
  ulong *puVar1;
  undefined8 *puVar2;
  undefined8 *puVar3;
  ulong uVar4;
  undefined8 uVar5;
  ulong uVar6;
  rtree_leaf_elm_t *prVar7;
  long lVar8;
  ulong uVar9;
  uint uVar10;
  uint uVar11;
  rtree_ctx_t *prVar12;
  rtree_ctx_t rtree_ctx_fallback;
  rtree_ctx_t rStack_328;
  rtree_ctx_t local_1a8;
  
  prVar12 = &rStack_328;
  if (tsdn == (tsdn_t *)0x0) {
    rtree_ctx_data_init(&rStack_328);
  }
  else {
    prVar12 = &(tsdn->tsd).cant_access_tsd_items_directly_use_a_getter_or_setter_rtree_ctx;
  }
  uVar10 = (uint)((ulong)ptr >> 0x1e) & 0xf;
  uVar9 = (ulong)ptr & 0xffffffffc0000000;
  uVar6 = (ulong)(uVar10 << 4);
  puVar1 = (ulong *)((long)&prVar12->cache[0].leafkey + uVar6);
  uVar6 = *(ulong *)((long)&prVar12->cache[0].leafkey + uVar6);
  uVar11 = (uint)ptr;
  if (uVar6 == uVar9) {
    prVar7 = (rtree_leaf_elm_t *)((ulong)((uint)((ulong)ptr >> 9) & 0x1ffff8) + puVar1[1]);
  }
  else if (prVar12->l2_cache[0].leafkey == uVar9) {
    prVar7 = prVar12->l2_cache[0].leaf;
    prVar12->l2_cache[0].leafkey = uVar6;
    prVar12->l2_cache[0].leaf = (rtree_leaf_elm_t *)puVar1[1];
    *puVar1 = uVar9;
    puVar1[1] = (ulong)prVar7;
    prVar7 = (rtree_leaf_elm_t *)
             ((long)&(prVar7->le_bits).repr + (ulong)((uint)((ulong)ptr >> 9) & 0x1ffff8));
  }
  else {
    lVar8 = 0x118;
    do {
      if (*(ulong *)((long)prVar12->cache + lVar8 + -8) == uVar9) {
        uVar4 = *(ulong *)((long)&prVar12->cache[0].leafkey + lVar8);
        puVar2 = (undefined8 *)((long)prVar12->cache + lVar8 + -0x18);
        uVar5 = puVar2[1];
        puVar3 = (undefined8 *)((long)prVar12->cache + lVar8 + -8);
        *puVar3 = *puVar2;
        puVar3[1] = uVar5;
        *(ulong *)((long)prVar12->cache + lVar8 + -0x18) = uVar6;
        *(ulong *)((long)(prVar12->cache + -1) + lVar8) = puVar1[1];
        *puVar1 = uVar9;
        puVar1[1] = uVar4;
        prVar7 = (rtree_leaf_elm_t *)(((uint)((ulong)ptr >> 9) & 0x1ffff8) + uVar4);
        goto LAB_0014d2f1;
      }
      lVar8 = lVar8 + 0x10;
    } while (lVar8 != 0x188);
    prVar7 = rtree_leaf_elm_lookup_hard(tsdn,&extents_rtree,prVar12,(uintptr_t)ptr,true,false);
  }
LAB_0014d2f1:
  if (((ulong)(prVar7->le_bits).repr & 1) == 0) {
    if (tsdn == (tsdn_t *)0x0) {
      prVar12 = &local_1a8;
      rtree_ctx_data_init(prVar12);
    }
    else {
      prVar12 = &(tsdn->tsd).cant_access_tsd_items_directly_use_a_getter_or_setter_rtree_ctx;
    }
    uVar6 = (ulong)(uVar10 << 4);
    puVar1 = (ulong *)((long)&prVar12->cache[0].leafkey + uVar6);
    uVar6 = *(ulong *)((long)&prVar12->cache[0].leafkey + uVar6);
    if (uVar6 == uVar9) {
      prVar7 = (rtree_leaf_elm_t *)((ulong)(uVar11 >> 9 & 0x1ffff8) + puVar1[1]);
    }
    else if (prVar12->l2_cache[0].leafkey == uVar9) {
      prVar7 = prVar12->l2_cache[0].leaf;
      prVar12->l2_cache[0].leafkey = uVar6;
      prVar12->l2_cache[0].leaf = (rtree_leaf_elm_t *)puVar1[1];
      *puVar1 = uVar9;
      puVar1[1] = (ulong)prVar7;
      prVar7 = (rtree_leaf_elm_t *)((long)&(prVar7->le_bits).repr + (ulong)(uVar11 >> 9 & 0x1ffff8))
      ;
    }
    else {
      lVar8 = 0x118;
      do {
        if (*(ulong *)((long)prVar12->cache + lVar8 + -8) == uVar9) {
          uVar4 = *(ulong *)((long)&prVar12->cache[0].leafkey + lVar8);
          puVar2 = (undefined8 *)((long)prVar12->cache + lVar8 + -0x18);
          uVar5 = puVar2[1];
          puVar3 = (undefined8 *)((long)prVar12->cache + lVar8 + -8);
          *puVar3 = *puVar2;
          puVar3[1] = uVar5;
          *(ulong *)((long)prVar12->cache + lVar8 + -0x18) = uVar6;
          *(ulong *)((long)(prVar12->cache + -1) + lVar8) = puVar1[1];
          *puVar1 = uVar9;
          puVar1[1] = uVar4;
          prVar7 = (rtree_leaf_elm_t *)((uVar11 >> 9 & 0x1ffff8) + uVar4);
          goto LAB_0014d38b;
        }
        lVar8 = lVar8 + 0x10;
      } while (lVar8 != 0x188);
      prVar7 = rtree_leaf_elm_lookup_hard(tsdn,&extents_rtree,prVar12,(uintptr_t)ptr,true,false);
    }
LAB_0014d38b:
    large_dalloc(tsdn,(extent_t *)
                      (((long)(prVar7->le_bits).repr << 0x10) >> 0x10 & 0xfffffffffffffffe));
  }
  else {
    arena_dalloc_small(tsdn,ptr);
  }
  return;
}

Assistant:

static inline void
arena_dalloc_no_tcache(tsdn_t *tsdn, void *ptr) {
	assert(ptr != NULL);

	rtree_ctx_t rtree_ctx_fallback;
	rtree_ctx_t *rtree_ctx = tsdn_rtree_ctx(tsdn, &rtree_ctx_fallback);

	szind_t szind;
	bool slab;
	rtree_szind_slab_read(tsdn, &extents_rtree, rtree_ctx, (uintptr_t)ptr,
	    true, &szind, &slab);

	if (config_debug) {
		extent_t *extent = rtree_extent_read(tsdn, &extents_rtree,
		    rtree_ctx, (uintptr_t)ptr, true);
		assert(szind == extent_szind_get(extent));
		assert(szind < SC_NSIZES);
		assert(slab == extent_slab_get(extent));
	}

	if (likely(slab)) {
		/* Small allocation. */
		arena_dalloc_small(tsdn, ptr);
	} else {
		extent_t *extent = iealloc(tsdn, ptr);
		large_dalloc(tsdn, extent);
	}
}